

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# samplers.cpp
# Opt level: O3

string * __thiscall
pbrt::SobolSampler::ToString_abi_cxx11_(string *__return_storage_ptr__,SobolSampler *this)

{
  (__return_storage_ptr__->_M_dataplus)._M_p = (pointer)&__return_storage_ptr__->field_2;
  __return_storage_ptr__->_M_string_length = 0;
  (__return_storage_ptr__->field_2)._M_local_buf[0] = '\0';
  detail::
  stringPrintfRecursive<pbrt::Point2<int>const&,int_const&,int_const&,int_const&,long_const&,pbrt::RandomizeStrategy_const&>
            (__return_storage_ptr__,
             "[ SobolSampler pixel: %s dimension: %d samplesPerPixel: %d scale: %d sobolIndex: %d randomizeStrategy: %s ]"
             ,&this->pixel,&this->dimension,&this->samplesPerPixel,&this->scale,&this->sobolIndex,
             &this->randomizeStrategy);
  return __return_storage_ptr__;
}

Assistant:

std::string SobolSampler::ToString() const {
    return StringPrintf("[ SobolSampler pixel: %s dimension: %d "
                        "samplesPerPixel: %d scale: %d sobolIndex: %d "
                        "randomizeStrategy: %s ]",
                        pixel, dimension, samplesPerPixel, scale, sobolIndex,
                        randomizeStrategy);
}